

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O2

int __thiscall glob::glob::open(glob *this,char *__file,int __oflag,...)

{
  int extraout_EAX;
  long lVar1;
  DIR *pDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  dir_and_file;
  
  lVar1 = std::__cxx11::string::find_last_of(__file,0x2d43c0);
  if (lVar1 == -1) {
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)&local_a0 + 8)
    ;
    local_a0.first = ".";
    std::__cxx11::string::string((string *)__x,(string *)__file);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&dir_and_file,&local_a0);
  }
  else {
    local_a0.first = (char *)((long)&local_a0 + 0x10);
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_a0,*(long *)__file,*(long *)__file + lVar1);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_78,*(long *)__file + lVar1 + 1,
               *(long *)__file + *(long *)(__file + 8));
    __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&dir_and_file,__x,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  std::__cxx11::string::~string((string *)__x);
  pDVar2 = opendir(dir_and_file.first._M_dataplus._M_p);
  ((this->impl_)._M_t.super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>.
   _M_t.super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
   super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl)->dir = (DIR *)pDVar2;
  std::__cxx11::string::_M_assign
            ((string *)
             (this->impl_)._M_t.
             super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
             super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
             super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl);
  if (((this->impl_)._M_t.
       super___uniq_ptr_impl<glob::glob_impl,_std::default_delete<glob::glob_impl>_>._M_t.
       super__Tuple_impl<0UL,_glob::glob_impl_*,_std::default_delete<glob::glob_impl>_>.
       super__Head_base<0UL,_glob::glob_impl_*,_false>._M_head_impl)->dir != (DIR *)0x0) {
    next(this);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&dir_and_file);
  return extraout_EAX;
}

Assistant:

void glob::open(const std::string &pattern) {
    auto dir_and_file = split_path(pattern);
    impl_->dir = opendir(dir_and_file.first.c_str());
    impl_->file_pattern = dir_and_file.second;

    if (impl_->dir != nullptr) {
        next();
    }
}